

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall jsonnet::internal::BuiltinFunction::~BuiltinFunction(BuiltinFunction *this)

{
  BuiltinFunction *in_RDI;
  
  ~BuiltinFunction(in_RDI);
  operator_delete(in_RDI,0xb8);
  return;
}

Assistant:

BuiltinFunction(const LocationRange &lr, const std::string &name, const Identifiers &params)
        : AST(lr, AST_BUILTIN_FUNCTION, Fodder{}), name(name), params(params)
    {
    }